

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleClassifier::setBinaryOutputClasses
          (TreeEnsembleClassifier *this,string *negativeClass,string *positiveClass)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string *local_20;
  string *positiveClass_local;
  string *negativeClass_local;
  TreeEnsembleClassifier *this_local;
  
  local_90 = &local_88;
  local_20 = positiveClass;
  positiveClass_local = negativeClass;
  negativeClass_local = (string *)this;
  std::__cxx11::string::string((string *)local_90,(string *)negativeClass);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68;
  std::__cxx11::string::string((string *)local_90,(string *)local_20);
  local_48 = &local_88;
  local_40 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_9d);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l,local_9d);
  setOutputClassList(this,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_9d);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_b8 = local_b8 + -1;
    std::__cxx11::string::~string((string *)local_b8);
  } while (local_b8 != &local_88);
  return;
}

Assistant:

void TreeEnsembleClassifier::setBinaryOutputClasses(const std::string& negativeClass, const std::string& positiveClass) {

        setOutputClassList({negativeClass, positiveClass});
    }